

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O2

bool __thiscall
bssl::spake2plus::Verifier::Init
          (Verifier *this,Span<const_unsigned_char> context,Span<const_unsigned_char> id_prover,
          Span<const_unsigned_char> id_verifier,Span<const_unsigned_char> w0,
          Span<const_unsigned_char> registration_record,Span<const_unsigned_char> y)

{
  int iVar1;
  EC_GROUP *group;
  
  group = EC_group_p256();
  iVar1 = ec_scalar_from_bytes(group,&this->w0_,w0.data_,w0.size_);
  if ((iVar1 != 0) &&
     (iVar1 = ec_point_from_uncompressed
                        (group,&this->L_,registration_record.data_,registration_record.size_),
     iVar1 != 0)) {
    if (y.size_ == 0) {
      iVar1 = ec_random_scalar(group,&this->y_,(anonymous_namespace)::kDefaultAdditionalData);
    }
    else {
      iVar1 = ec_scalar_from_bytes(group,&this->y_,y.data_,y.size_);
    }
    if (iVar1 != 0) {
      anon_unknown_0::InitTranscriptHash(&this->transcript_hash_,context,id_prover,id_verifier);
      return true;
    }
  }
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,0x18b);
  return false;
}

Assistant:

bool Verifier::Init(Span<const uint8_t> context, Span<const uint8_t> id_prover,
                    Span<const uint8_t> id_verifier, Span<const uint8_t> w0,
                    Span<const uint8_t> registration_record,
                    Span<const uint8_t> y) {
  const EC_GROUP *group = EC_group_p256();

  if (!ec_scalar_from_bytes(group, &w0_, w0.data(), w0.size()) ||
      !ec_point_from_uncompressed(group, &L_, registration_record.data(),
                                  registration_record.size()) ||  //
      (!y.empty() &&
       !ec_scalar_from_bytes(group, &y_, y.data(), y.size())) ||  //
      (y.empty() && !ec_random_scalar(group, &y_, kDefaultAdditionalData))) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  InitTranscriptHash(&transcript_hash_, context, id_prover, id_verifier);

  return true;
}